

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accel.h
# Opt level: O1

int __thiscall
embree::Accel::Intersectors::select
          (Intersectors *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  OccludedFunc16 p_Var1;
  Intersector16 *in_RAX;
  char cVar2;
  
  cVar2 = (char)__nfds;
  if ((this->intersector4_filter).name != (char *)0x0) {
    in_RAX = (Intersector16 *)&this->intersector4_nofilter;
    if (cVar2 != '\0') {
      in_RAX = (Intersector16 *)&this->intersector4_filter;
    }
    (this->intersector4).name = in_RAX->name;
    p_Var1 = in_RAX->occluded;
    (this->intersector4).intersect = (IntersectFunc4)in_RAX->intersect;
    (this->intersector4).occluded = (OccludedFunc4)p_Var1;
  }
  if ((this->intersector8_filter).name != (char *)0x0) {
    in_RAX = (Intersector16 *)&this->intersector8_nofilter;
    if (cVar2 != '\0') {
      in_RAX = (Intersector16 *)&this->intersector8_filter;
    }
    (this->intersector8).name = in_RAX->name;
    p_Var1 = in_RAX->occluded;
    (this->intersector8).intersect = (IntersectFunc8)in_RAX->intersect;
    (this->intersector8).occluded = (OccludedFunc8)p_Var1;
  }
  if ((this->intersector16_filter).name != (char *)0x0) {
    in_RAX = &this->intersector16_nofilter;
    if (cVar2 != '\0') {
      in_RAX = &this->intersector16_filter;
    }
    (this->intersector16).name = in_RAX->name;
    p_Var1 = in_RAX->occluded;
    (this->intersector16).intersect = in_RAX->intersect;
    (this->intersector16).occluded = p_Var1;
  }
  return (int)in_RAX;
}

Assistant:

operator bool() const { return name; }